

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * __thiscall
minja::strip(string *__return_storage_ptr__,minja *this,string *s,string *chars,bool left,bool right
            )

{
  long lVar1;
  string *extraout_RAX;
  string *psVar2;
  string *extraout_RAX_00;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  if (chars == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48," \t\n\r","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,s,(long)&(chars->_M_dataplus)._M_p + (long)&(s->_M_dataplus)._M_p)
    ;
  }
  if ((left) &&
     (lVar1 = std::__cxx11::string::find_first_not_of((char *)this,(ulong)local_48[0],0),
     lVar1 == -1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    psVar2 = extraout_RAX;
  }
  else {
    if (right) {
      std::__cxx11::string::find_last_not_of((char *)this,(ulong)local_48[0],0xffffffffffffffff);
    }
    psVar2 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

static std::string strip(const std::string & s, const std::string & chars = "", bool left = true, bool right = true) {
  auto charset = chars.empty() ? " \t\n\r" : chars;
  auto start = left ? s.find_first_not_of(charset) : 0;
  if (start == std::string::npos) return "";
  auto end = right ? s.find_last_not_of(charset) : s.size() - 1;
  return s.substr(start, end - start + 1);
}